

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_init_float128(flexfloat_t *obj,__float128 value,flexfloat_desc_t desc)

{
  undefined8 uVar1;
  undefined2 in_SI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined6 in_stack_00000020;
  
  uVar1 = __trunctfdf2(in_XMM0_Da);
  *in_RDI = uVar1;
  *(undefined2 *)(in_RDI + 1) = in_SI;
  flexfloat_sanitize((flexfloat_t *)CONCAT26(desc,in_stack_00000020));
  return;
}

Assistant:

INLINE void ff_init_float128(flexfloat_t *obj, __float128 value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}